

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qitemselectionmodel.h
# Opt level: O3

bool __thiscall QItemSelectionRange::contains(QItemSelectionRange *this,QModelIndex *index)

{
  int iVar1;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int iVar4;
  long in_FS_OFFSET;
  bool bVar5;
  undefined8 local_58;
  quintptr local_50;
  QAbstractItemModel *pQStack_48;
  QModelIndex local_40;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar4 = index->r;
  iVar1 = index->c;
  pQVar2 = (index->m).ptr;
  if (pQVar2 == (QAbstractItemModel *)0x0) {
    local_58 = 0xffffffffffffffff;
    local_50 = 0;
    pQStack_48 = (QAbstractItemModel *)0x0;
  }
  else {
    (*(pQVar2->super_QObject)._vptr_QObject[0xd])(&local_58,pQVar2,index);
  }
  iVar3 = QPersistentModelIndex::row(&this->br);
  if (iVar4 <= iVar3) {
    iVar3 = QPersistentModelIndex::column(&this->br);
    if (iVar1 <= iVar3) {
      iVar3 = QPersistentModelIndex::row(&this->tl);
      if (iVar3 <= iVar4) {
        iVar4 = QPersistentModelIndex::column(&this->tl);
        if (iVar4 <= iVar1) {
          QPersistentModelIndex::parent(&local_40,&this->tl);
          if (((local_40.r == (int)local_58) && (local_40.c == local_58._4_4_)) &&
             (local_40.i == local_50)) {
            bVar5 = local_40.m.ptr == pQStack_48;
            goto LAB_00464859;
          }
        }
      }
    }
  }
  bVar5 = false;
LAB_00464859:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

inline bool contains(const QModelIndex &index) const
    {
        return contains(index.row(), index.column(), index.parent());
    }